

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

int __thiscall jrtplib::RTPUDPv4Transmitter::AbortWait(RTPUDPv4Transmitter *this)

{
  int iVar1;
  
  if (this->init == true) {
    if (this->created == true) {
      if (this->waitingfordata == true) {
        RTPAbortDescriptors::SendAbortSignal(this->m_pAbortDesc);
        return 0;
      }
      iVar1 = -0x5b;
    }
    else {
      iVar1 = -0x59;
    }
  }
  else {
    iVar1 = -0x5a;
  }
  return iVar1;
}

Assistant:

int RTPUDPv4Transmitter::AbortWait()
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (!waitingfordata)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTWAITING;
	}

	m_pAbortDesc->SendAbortSignal();
	
	MAINMUTEX_UNLOCK
	return 0;
}